

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_main.c
# Opt level: O0

int format_seg(char *outptr,int len,ps_seg_t *seg,double utt_start,int frate,logmath_t *lmath)

{
  double lmath_00;
  int32 logb_p;
  int iVar1;
  char *local_60;
  char *word;
  int ef;
  int sf;
  double dur;
  double st;
  double prob;
  logmath_t *lmath_local;
  double dStack_28;
  int frate_local;
  double utt_start_local;
  ps_seg_t *seg_local;
  char *pcStack_10;
  int len_local;
  char *outptr_local;
  
  prob = (double)lmath;
  lmath_local._4_4_ = frate;
  dStack_28 = utt_start;
  utt_start_local = (double)seg;
  seg_local._4_4_ = len;
  pcStack_10 = outptr;
  ps_seg_frames(seg,(int *)((long)&word + 4),(int *)&word);
  dur = dStack_28 + (double)word._4_4_ / (double)lmath_local._4_4_;
  _ef = (double)(((int)word + 1) - word._4_4_) / (double)lmath_local._4_4_;
  local_60 = ps_seg_word((ps_seg_t *)utt_start_local);
  lmath_00 = prob;
  if (local_60 == (char *)0x0) {
    local_60 = "";
  }
  logb_p = ps_seg_prob((ps_seg_t *)utt_start_local,(int32 *)0x0,(int32 *)0x0,(int32 *)0x0);
  st = (double)logmath_exp((logmath_t *)lmath_00,logb_p);
  iVar1 = snprintf(pcStack_10,(long)seg_local._4_4_,"{\"b\":%.3f,\"d\":%.3f,\"p\":%.3f,\"t\":\"%s\""
                   ,dur,_ef,st,local_60);
  if (pcStack_10 != (char *)0x0) {
    pcStack_10[iVar1] = '}';
    (pcStack_10 + iVar1)[1] = '\0';
  }
  return iVar1 + 1;
}

Assistant:

static int
format_seg(char *outptr, int len, ps_seg_t *seg,
           double utt_start, int frate,
           logmath_t *lmath)
{
    double prob, st, dur;
    int sf, ef;
    const char *word;

    ps_seg_frames(seg, &sf, &ef);
    st = utt_start + (double)sf / frate;
    dur = (double)(ef + 1 - sf) / frate;
    word = ps_seg_word(seg);
    if (word == NULL)
        word = "";
    prob = logmath_exp(lmath, ps_seg_prob(seg, NULL, NULL, NULL));
    len = snprintf(outptr, len, HYP_FORMAT, st, dur, prob, word);
    if (outptr) {
        outptr += len;
        *outptr++ = '}';
        *outptr = '\0';
    }
    len++;
    return len;
}